

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::OptionalSemicolon(SQCompiler *this)

{
  bool bVar1;
  SQCompiler *this_local;
  
  if (this->_token == 0x3b) {
    Lex(this);
  }
  else {
    bVar1 = IsEndOfStatement(this);
    if (!bVar1) {
      Error(this,"end of statement expected (; or lf)");
    }
  }
  return;
}

Assistant:

void OptionalSemicolon()
    {
        if(_token == _SC(';')) { Lex(); return; }
        if(!IsEndOfStatement()) {
            Error(_SC("end of statement expected (; or lf)"));
        }
    }